

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::rotateLeft
          (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this,node *x)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  
  ptVar1 = x->right;
  ptVar2 = ptVar1->left;
  x->right = ptVar2;
  if (ptVar2 != (this->m_tree).NIL) {
    ptVar2->parent = x;
  }
  ptVar1->parent = x->parent;
  if ((this->m_tree).m_root == x) {
LAB_00109422:
    this = (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)&this->m_tree;
  }
  else {
    this = (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)x->parent;
    if ((this->m_tree).NIL != x) {
      if ((this->m_tree).m_root != x) goto LAB_0010942f;
      goto LAB_00109422;
    }
  }
  (this->m_tree).NIL = ptVar1;
LAB_0010942f:
  ptVar1->left = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateLeft(node* x)
	{
		node*	y = x->right;

		x->right = y->left;
		if (y->left != this->NIL())
			y->left->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		y->left = x;
		x->parent = y;
	}